

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O2

void __thiscall SceneRender::renderShadowMap(SceneRender *this,Uniforms *_uniforms)

{
  Light *pLVar1;
  Model *this_00;
  Shader *pSVar2;
  mat4 *pmVar3;
  mat<4,_4,_float,_(glm::qualifier)0> *pmVar4;
  vec<3,_float,_(glm::qualifier)0> *v2;
  _Base_ptr p_Var5;
  _Rb_tree_node_base *p_Var6;
  allocator local_d9;
  Tracker *local_d8;
  SceneRender *local_d0;
  vec<3,_float,_(glm::qualifier)0> local_c8;
  mat4 *local_a8;
  mat4 *local_a0;
  Model *local_98;
  vec<3,_float,_(glm::qualifier)0> *local_90;
  string local_88 [2];
  vec<3,_float,_(glm::qualifier)0> *local_48;
  _Rb_tree_node_base *local_40;
  _Rb_tree_node_base *local_38;
  
  if (this->m_shadows == true) {
    local_d8 = &_uniforms->tracker;
    local_d0 = this;
    if ((_uniforms->tracker).m_running == true) {
      std::__cxx11::string::string
                ((string *)local_88,"render:scene:shadowmap",(allocator *)&local_c8);
      Tracker::begin(local_d8,local_88);
      std::__cxx11::string::~string((string *)local_88);
    }
    local_40 = &(_uniforms->super_Scene).lights._M_t._M_impl.super__Rb_tree_header._M_header;
    local_98 = &local_d0->m_floor;
    local_a8 = &(local_d0->m_origin).m_transformMatrix;
    local_a0 = &(local_d0->m_floor).super_Node.m_transformMatrix;
    local_90 = &(local_d0->m_origin).m_position;
    local_48 = &(local_d0->m_floor).super_Node.m_position;
    local_38 = &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header;
    for (p_Var6 = (_uniforms->super_Scene).lights._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left; p_Var6 != local_40;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      if (((local_d0->dynamicShadows != false) ||
          (((*(Light **)(p_Var6 + 2))->super_Node).bChange != false)) ||
         ((local_d0->m_origin).bChange == true)) {
        vera::Light::bindShadowMap(*(Light **)(p_Var6 + 2));
        std::__cxx11::string::string((string *)local_88,"shadow",(allocator *)&local_c8);
        pSVar2 = vera::Model::getBufferShader(local_98,local_88);
        std::__cxx11::string::~string((string *)local_88);
        if ((pSVar2 != (Shader *)0x0) && ((local_d0->m_floor).m_model_vbo != (Vbo *)0x0)) {
          if ((_uniforms->tracker).m_running == true) {
            std::__cxx11::string::string
                      ((string *)local_88,"render:scene:shadowmap:floor",(allocator *)&local_c8);
            Tracker::begin(local_d8,local_88);
            std::__cxx11::string::~string((string *)local_88);
          }
          vera::Shader::use(pSVar2);
          (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar2,0);
          std::__cxx11::string::string((string *)&local_c8,"u_modelViewProjectionMatrix",&local_d9);
          pLVar1 = *(Light **)(p_Var6 + 2);
          glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_88,local_a8,local_a0);
          pmVar3 = vera::Light::getMVPMatrix(pLVar1,(mat4 *)local_88,local_d0->m_area);
          vera::Shader::setUniform(pSVar2,(string *)&local_c8,pmVar3,false);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::string
                    ((string *)local_88,"u_projectionMatrix",(allocator *)&local_c8);
          vera::Shader::setUniform(pSVar2,local_88,(mat4 *)(*(long *)(p_Var6 + 2) + 0x148),false);
          std::__cxx11::string::~string((string *)local_88);
          std::__cxx11::string::string((string *)local_88,"u_viewMatrix",(allocator *)&local_c8);
          vera::Shader::setUniform(pSVar2,local_88,(mat4 *)(*(long *)(p_Var6 + 2) + 0x108),false);
          std::__cxx11::string::~string((string *)local_88);
          std::__cxx11::string::string((string *)&local_c8,"u_modelMatrix",&local_d9);
          glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_88,local_a8,local_a0);
          vera::Shader::setUniform(pSVar2,(string *)&local_c8,(mat4 *)local_88,false);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::string((string *)local_88,"u_model",&local_d9);
          local_c8 = glm::operator+(local_90,local_48);
          vera::Shader::setUniform(pSVar2,local_88,&local_c8);
          std::__cxx11::string::~string((string *)local_88);
          vera::Model::render(local_98,pSVar2);
          if ((_uniforms->tracker).m_running == true) {
            std::__cxx11::string::string
                      ((string *)local_88,"render:scene:shadowmap:floor",(allocator *)&local_c8);
            Tracker::end(local_d8,local_88);
            std::__cxx11::string::~string((string *)local_88);
          }
        }
        for (p_Var5 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_left; p_Var5 != local_38;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          this_00 = *(Model **)(p_Var5 + 2);
          std::__cxx11::string::string((string *)local_88,"shadow",(allocator *)&local_c8);
          pSVar2 = vera::Model::getBufferShader(this_00,local_88);
          std::__cxx11::string::~string((string *)local_88);
          if (pSVar2 != (Shader *)0x0) {
            if ((_uniforms->tracker).m_running == true) {
              std::operator+(local_88,"render:scene:shadowmap:",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (*(long *)(p_Var5 + 2) + 0x2b0));
              Tracker::begin(local_d8,local_88);
              std::__cxx11::string::~string((string *)local_88);
            }
            vera::Shader::use(pSVar2);
            (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar2,0);
            std::__cxx11::string::string
                      ((string *)&local_c8,"u_modelViewProjectionMatrix",&local_d9);
            pLVar1 = *(Light **)(p_Var6 + 2);
            pmVar4 = (mat<4,_4,_float,_(glm::qualifier)0> *)
                     (**(code **)(**(long **)(p_Var5 + 2) + 0x100))();
            glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_88,local_a8,pmVar4);
            pmVar3 = vera::Light::getMVPMatrix(pLVar1,(mat4 *)local_88,local_d0->m_area);
            vera::Shader::setUniform(pSVar2,(string *)&local_c8,pmVar3,false);
            std::__cxx11::string::~string((string *)&local_c8);
            std::__cxx11::string::string
                      ((string *)local_88,"u_projectionMatrix",(allocator *)&local_c8);
            vera::Shader::setUniform(pSVar2,local_88,(mat4 *)(*(long *)(p_Var6 + 2) + 0x148),false);
            std::__cxx11::string::~string((string *)local_88);
            std::__cxx11::string::string((string *)local_88,"u_viewMatrix",(allocator *)&local_c8);
            vera::Shader::setUniform(pSVar2,local_88,(mat4 *)(*(long *)(p_Var6 + 2) + 0x108),false);
            std::__cxx11::string::~string((string *)local_88);
            std::__cxx11::string::string((string *)&local_c8,"u_modelMatrix",&local_d9);
            pmVar4 = (mat<4,_4,_float,_(glm::qualifier)0> *)
                     (**(code **)(**(long **)(p_Var5 + 2) + 0x100))();
            glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_88,local_a8,pmVar4);
            vera::Shader::setUniform(pSVar2,(string *)&local_c8,(mat4 *)local_88,false);
            std::__cxx11::string::~string((string *)&local_c8);
            std::__cxx11::string::string((string *)local_88,"u_model",&local_d9);
            v2 = (vec<3,_float,_(glm::qualifier)0> *)(**(code **)(**(long **)(p_Var5 + 2) + 0x98))()
            ;
            local_c8 = glm::operator+(local_90,v2);
            vera::Shader::setUniform(pSVar2,local_88,(vec3 *)&local_c8);
            std::__cxx11::string::~string((string *)local_88);
            vera::Model::render(*(Model **)(p_Var5 + 2),pSVar2);
            if ((_uniforms->tracker).m_running == true) {
              std::operator+(local_88,"render:scene:shadowmap:",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (*(long *)(p_Var5 + 2) + 0x2b0));
              Tracker::end(local_d8,local_88);
              std::__cxx11::string::~string((string *)local_88);
            }
          }
        }
        vera::Light::unbindShadowMap(*(Light **)(p_Var6 + 2));
      }
    }
    if ((_uniforms->tracker).m_running != false) {
      std::__cxx11::string::string((string *)local_88,"shadowmap",(allocator *)&local_c8);
      Tracker::end(local_d8,local_88);
      std::__cxx11::string::~string((string *)local_88);
    }
  }
  return;
}

Assistant:

void SceneRender::renderShadowMap(Uniforms& _uniforms) {
    if (!m_shadows)
        return;

    TRACK_BEGIN("render:scene:shadowmap")
    vera::Shader* shadowShader = nullptr;
    for (vera::LightsMap::iterator lit = _uniforms.lights.begin(); lit != _uniforms.lights.end(); ++lit) {
        if (dynamicShadows ||  lit->second->bChange || haveChange() ) {
            // Temporally move the MVP matrix from the view of the light 
            glm::mat4 m = m_origin.getTransformMatrix();
            // glm::mat4 p = lit->second->getProjectionMatrix();
            // glm::mat4 v = lit->second->getViewMatrix();
            
            lit->second->bindShadowMap();

            shadowShader = m_floor.getBufferShader("shadow");
            if (m_floor.getVbo() && shadowShader != nullptr) {
                TRACK_BEGIN("render:scene:shadowmap:floor")
                shadowShader->use();
                _uniforms.feedTo( shadowShader, false );
                shadowShader->setUniform( "u_modelViewProjectionMatrix", lit->second->getMVPMatrix( m_origin.getTransformMatrix() * m_floor.getTransformMatrix(), m_area ) );
                shadowShader->setUniform( "u_projectionMatrix", lit->second->getProjectionMatrix() );
                shadowShader->setUniform( "u_viewMatrix", lit->second->getViewMatrix() );
                shadowShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * m_floor.getTransformMatrix() );
                shadowShader->setUniform( "u_model", m_origin.getPosition() + m_floor.getPosition() );
                m_floor.render(shadowShader);
                TRACK_END("render:scene:shadowmap:floor")
            }

            for (vera::ModelsMap::iterator mit = _uniforms.models.begin(); mit != _uniforms.models.end(); ++mit) {
                shadowShader = mit->second->getBufferShader("shadow");
                if (shadowShader != nullptr) {
                    TRACK_BEGIN("render:scene:shadowmap:" + mit->second->getName())

                    // bind the shader
                    shadowShader->use();

                    // Update Uniforms and textures variables to the shader
                    _uniforms.feedTo( shadowShader, false );

                    // Pass special uniforms
                    shadowShader->setUniform( "u_modelViewProjectionMatrix", lit->second->getMVPMatrix( m_origin.getTransformMatrix() * mit->second->getTransformMatrix(), m_area ) );
                    shadowShader->setUniform( "u_projectionMatrix", lit->second->getProjectionMatrix() );
                    shadowShader->setUniform( "u_viewMatrix", lit->second->getViewMatrix() );
                    shadowShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * mit->second->getTransformMatrix() );
                    shadowShader->setUniform( "u_model", m_origin.getPosition() + mit->second->getPosition() );
                    mit->second->render(shadowShader);

                    TRACK_END("render:scene:shadowmap:" + mit->second->getName())
                }
            }

            lit->second->unbindShadowMap();
        }
    }
    TRACK_END("shadowmap")
}